

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

ON_PostEffect * __thiscall ON_PostEffects::PostEffectFromId(ON_PostEffects *this,ON_UUID *id)

{
  CImpl *this_00;
  uint uVar1;
  ON_PostEffect *pOVar2;
  
  uVar1 = CImpl::IndexOfPostEffect(this->_impl,id);
  if ((int)uVar1 < 0) {
    pOVar2 = (ON_PostEffect *)0x0;
  }
  else {
    this_00 = this->_impl;
    CImpl::EnsurePopulated(this_00);
    pOVar2 = (this_00->_peps).m_a[uVar1];
  }
  return pOVar2;
}

Assistant:

ON_PostEffect* ON_PostEffects::PostEffectFromId(const ON_UUID& id)
{
  const int index = _impl->IndexOfPostEffect(id);
  if (index < 0)
    return nullptr;

  return _impl->PostEffectList()[index];
}